

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O3

void __thiscall
CompareTxMemPoolEntryByDescendantScore::GetModFeeAndSize
          (CompareTxMemPoolEntryByDescendantScore *this,CTxMemPoolEntry *a,double *mod_fee,
          double *size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  long in_FS_OFFSET;
  double dVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = a->m_modified_fee;
  lVar3 = a->nSizeWithDescendants;
  lVar4 = a->nModFeesWithDescendants;
  iVar5 = GetVirtualTransactionSize((long)a->nTxWeight,a->sigOpCost,nBytesPerSigOp);
  if ((double)(int)iVar5 * (double)lVar4 <= (double)lVar3 * (double)lVar2) {
    *mod_fee = (double)a->m_modified_fee;
    iVar5 = GetVirtualTransactionSize((long)a->nTxWeight,a->sigOpCost,nBytesPerSigOp);
    dVar6 = (double)(int)iVar5;
  }
  else {
    *mod_fee = (double)a->nModFeesWithDescendants;
    dVar6 = (double)a->nSizeWithDescendants;
  }
  *size = dVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetModFeeAndSize(const CTxMemPoolEntry &a, double &mod_fee, double &size) const
    {
        // Compare feerate with descendants to feerate of the transaction, and
        // return the fee/size for the max.
        double f1 = (double)a.GetModifiedFee() * a.GetSizeWithDescendants();
        double f2 = (double)a.GetModFeesWithDescendants() * a.GetTxSize();

        if (f2 > f1) {
            mod_fee = a.GetModFeesWithDescendants();
            size = a.GetSizeWithDescendants();
        } else {
            mod_fee = a.GetModifiedFee();
            size = a.GetTxSize();
        }
    }